

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[58]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [29],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [17],char **Args_4,char (*Args_5) [12],uint *Args_6,
          char (*Args_7) [49],uint *Args_8,char (*Args_9) [18],char **Args_10,char (*Args_11) [58])

{
  stringstream local_1e8 [8];
  stringstream ss;
  char **Args_local_4;
  char (*Args_local_3) [17];
  char (*Args_local_2) [15];
  char **Args_local_1;
  char (*Args_local) [29];
  
  std::__cxx11::stringstream::stringstream(local_1e8);
  FormatStrSS<std::__cxx11::stringstream,char[29],char_const*,char[15],char[17],char_const*,char[12],unsigned_int,char[49],unsigned_int,char[18],char_const*,char[58]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
             (char (*) [29])this,(char **)Args,(char (*) [15])Args_1,(char (*) [17])Args_2,
             (char **)Args_3,(char (*) [12])Args_4,(uint *)Args_5,(char (*) [49])Args_6,
             (uint *)Args_7,(char (*) [18])Args_8,(char **)Args_9,(char (*) [58])Args_10);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1e8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}